

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::parse(QPDF *this,char *password)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  char *str;
  QPDFExc *pQVar7;
  size_type sVar8;
  byte local_3f9;
  long local_3a8;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  byte local_2fc;
  byte local_2fb;
  byte local_2fa;
  allocator<char> local_2f9;
  string local_2f8 [39];
  byte local_2d1;
  string local_2d0;
  QPDFExc *e;
  QPDFExc *anon_var_0;
  exception *e_1;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  Token local_1d8;
  long local_170;
  qpdf_offset_t xref_offset;
  undefined8 local_160;
  undefined1 local_158 [8];
  PatternFinder sf;
  qpdf_offset_t start_offset;
  qpdf_offset_t end_offset;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  QPDFExc local_d8;
  code *local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  PatternFinder hf;
  char *password_local;
  QPDF *this_local;
  
  hf._24_8_ = password;
  if (password != (char *)0x0) {
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar5 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->encp);
    std::__cxx11::string::operator=((string *)&peVar5->provided_password,password);
  }
  local_48 = findHeader;
  local_40 = 0;
  PatternFinder::PatternFinder((PatternFinder *)local_38,this,0x2c3d20);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  bVar2 = InputSource::findFirst(peVar6,"%PDF-",0,0x400,(Finder *)local_38);
  if (!bVar2) {
    QTC::TC("qpdf","QPDF not a pdf file",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"can\'t find PDF header",
               (allocator<char> *)((long)&end_offset + 7));
    damagedPDF(&local_d8,this,&local_f8,-1,&local_120);
    warn(this,&local_d8);
    QPDFExc::~QPDFExc(&local_d8);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&end_offset + 7));
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::__cxx11::string::operator=((string *)&pMVar4->pdf_version,"1.2");
  }
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  (*peVar6->_vptr_InputSource[5])(peVar6,0,2);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  iVar3 = (*peVar6->_vptr_InputSource[4])();
  local_3a8 = CONCAT44(extraout_var,iVar3);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar4->xref_table_max_offset = local_3a8;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  iVar3 = pMVar4->xref_table_max_id;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (pMVar4->xref_table_max_offset / 3 < (long)iVar3) {
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    lVar1 = pMVar4->xref_table_max_offset;
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar4->xref_table_max_id = (int)(lVar1 / 3);
  }
  if (local_3a8 < 0x41f) {
    local_3a8 = 0;
  }
  else {
    local_3a8 = local_3a8 + -0x41e;
  }
  sf._24_8_ = local_3a8;
  xref_offset = (qpdf_offset_t)findStartxref;
  local_160 = 0;
  PatternFinder::PatternFinder((PatternFinder *)local_158,this,0x4debf0);
  local_170 = 0;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  bVar2 = InputSource::findLast(peVar6,"startxref",sf._24_8_,0,(Finder *)local_158);
  if (bVar2) {
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar4->file);
    readToken(&local_1d8,this,peVar6,0);
    QPDFTokenizer::Token::getValue_abi_cxx11_(&local_1d8);
    str = (char *)std::__cxx11::string::c_str();
    local_170 = QUtil::string_to_ll(str);
    QPDFTokenizer::Token::~Token(&local_1d8);
  }
  if (local_170 != 0) {
    read_xref(this,local_170);
    initializeEncryption(this);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar4->parsed = true;
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar8 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::size(&pMVar4->xref_table);
    local_2d1 = 0;
    local_2fa = 0;
    local_2fb = 0;
    local_2fc = 0;
    local_3f9 = 0;
    if (sVar8 != 0) {
      getRoot((QPDF *)&local_2d0);
      local_2d1 = 1;
      std::allocator<char>::allocator();
      local_2fa = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_2f8,"/Pages",&local_2f9);
      local_2fb = 1;
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d0.field_2,&local_2d0);
      local_2fc = 1;
      bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_2d0.field_2);
      local_3f9 = bVar2 ^ 0xff;
    }
    if ((local_2fc & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d0.field_2);
    }
    if ((local_2fb & 1) != 0) {
      std::__cxx11::string::~string(local_2f8);
    }
    if ((local_2fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_2f9);
    }
    if ((local_2d1 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d0);
    }
    if ((local_3f9 & 1) != 0) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"unable to find page tree",&local_349);
      damagedPDF(pQVar7,this,&local_320,-1,&local_348);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    PatternFinder::~PatternFinder((PatternFinder *)local_158);
    PatternFinder::~PatternFinder((PatternFinder *)local_38);
    return;
  }
  QTC::TC("qpdf","QPDF can\'t find startxref",0);
  e_1._6_1_ = 1;
  pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"can\'t find startxref",(allocator<char> *)((long)&e_1 + 7));
  damagedPDF(pQVar7,this,&local_1f8,-1,&local_220);
  e_1._6_1_ = 0;
  __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::parse(char const* password)
{
    if (password) {
        m->encp->provided_password = password;
    }

    // Find the header anywhere in the first 1024 bytes of the file.
    PatternFinder hf(*this, &QPDF::findHeader);
    if (!m->file->findFirst("%PDF-", 0, 1024, hf)) {
        QTC::TC("qpdf", "QPDF not a pdf file");
        warn(damagedPDF("", -1, "can't find PDF header"));
        // QPDFWriter writes files that usually require at least version 1.2 for /FlateDecode
        m->pdf_version = "1.2";
    }

    // PDF spec says %%EOF must be found within the last 1024 bytes of/ the file.  We add an extra
    // 30 characters to leave room for the startxref stuff.
    m->file->seek(0, SEEK_END);
    qpdf_offset_t end_offset = m->file->tell();
    m->xref_table_max_offset = end_offset;
    // Sanity check on object ids. All objects must appear in xref table / stream. In all realistic
    // scenarios at least 3 bytes are required.
    if (m->xref_table_max_id > m->xref_table_max_offset / 3) {
        m->xref_table_max_id = static_cast<int>(m->xref_table_max_offset / 3);
    }
    qpdf_offset_t start_offset = (end_offset > 1054 ? end_offset - 1054 : 0);
    PatternFinder sf(*this, &QPDF::findStartxref);
    qpdf_offset_t xref_offset = 0;
    if (m->file->findLast("startxref", start_offset, 0, sf)) {
        xref_offset = QUtil::string_to_ll(readToken(*m->file).getValue().c_str());
    }

    try {
        if (xref_offset == 0) {
            QTC::TC("qpdf", "QPDF can't find startxref");
            throw damagedPDF("", -1, "can't find startxref");
        }
        try {
            read_xref(xref_offset);
        } catch (QPDFExc&) {
            throw;
        } catch (std::exception& e) {
            throw damagedPDF("", -1, std::string("error reading xref: ") + e.what());
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            reconstruct_xref(e, xref_offset > 0);
            QTC::TC("qpdf", "QPDF reconstructed xref table");
        } else {
            throw;
        }
    }

    initializeEncryption();
    m->parsed = true;
    if (m->xref_table.size() > 0 && !getRoot().getKey("/Pages").isDictionary()) {
        // QPDFs created from JSON have an empty xref table and no root object yet.
        throw damagedPDF("", -1, "unable to find page tree");
    }
}